

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicEventTests.cpp
# Opt level: O2

TestStatus *
vkt::synchronization::anon_unknown_0::deviceWaitForEventCase
          (TestStatus *__return_storage_ptr__,Context *context)

{
  deUint32 queueFamilyIndex;
  VkResult result;
  int iVar1;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue pVVar2;
  allocator<char> local_139;
  string local_138;
  RefBase<vk::Handle<(vk::HandleType)6>_> local_118;
  RefBase<vk::Handle<(vk::HandleType)10>_> local_f8;
  RefBase<vk::VkCommandBuffer_s_*> local_d8;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_b8;
  VkSubmitInfo submitInfo;
  VkEventCreateInfo eventInfo;
  
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  pVVar2 = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  local_118.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_118.m_data.deleter.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_118.m_data.object.m_internal = submitInfo._0_8_;
  local_118.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&submitInfo);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&submitInfo,vk,device,2,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  local_b8.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_b8.m_data.object.m_internal = submitInfo._0_8_;
  local_b8.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&submitInfo);
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&submitInfo,vk,device,
                    (VkCommandPool)local_b8.m_data.object.m_internal);
  local_d8.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_d8.m_data.deleter.m_pool.m_internal = (deUint64)submitInfo.pWaitSemaphores;
  local_d8.m_data.object = (VkCommandBuffer_s *)submitInfo._0_8_;
  local_d8.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&submitInfo);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  eventInfo.flags = 0;
  eventInfo._20_4_ = 0;
  eventInfo.sType = VK_STRUCTURE_TYPE_EVENT_CREATE_INFO;
  eventInfo._4_4_ = 0;
  eventInfo.pNext = (void *)0x0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&local_d8;
  ::vk::createEvent((Move<vk::Handle<(vk::HandleType)10>_> *)&local_138,vk,device,&eventInfo,
                    (VkAllocationCallbacks *)0x0);
  local_f8.m_data.deleter.m_device = (VkDevice)local_138.field_2._M_allocated_capacity;
  local_f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_138.field_2._8_8_;
  local_f8.m_data.object.m_internal = (deUint64)local_138._M_dataplus._M_p;
  local_f8.m_data.deleter.m_deviceIface = (DeviceInterface *)local_138._M_string_length;
  local_138._M_dataplus._M_p = (pointer)0x0;
  local_138._M_string_length = 0;
  local_138.field_2._M_allocated_capacity = 0;
  local_138.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)10>_> *)&local_138);
  beginCommandBuffer(vk,local_d8.m_data.object);
  (*vk->_vptr_DeviceInterface[0x6c])
            (vk,local_d8.m_data.object,1,&local_f8,0x4000,0x10000,0,0,0,0,0,0);
  endCommandBuffer(vk,local_d8.m_data.object);
  result = (*vk->_vptr_DeviceInterface[2])
                     (vk,pVVar2,1,&submitInfo,local_118.m_data.object.m_internal);
  ::vk::checkResult(result,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicEventTests.cpp"
                    ,0x9e);
  iVar1 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_118,1,1000);
  if (iVar1 == 2) {
    iVar1 = (*vk->_vptr_DeviceInterface[0x1c])(vk,device,local_f8.m_data.object.m_internal);
    if (iVar1 == 0) {
      iVar1 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_118,1,0xffffffffffffffff);
      if (iVar1 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"Device wait for event tests pass",&local_139);
        tcu::TestStatus::pass(__return_storage_ptr__,&local_138);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"Queue should end execution",&local_139);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_138);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"Couldn\'t set event",&local_139);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_138);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"Queue should not end execution",&local_139);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_138);
  }
  std::__cxx11::string::~string((string *)&local_138);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::~RefBase(&local_f8);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_d8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_b8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase(&local_118);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus deviceWaitForEventCase (Context& context)
{
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	const Unique<VkFence>			fence				(createFence(vk, device));
	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer			(makeCommandBuffer(vk, device, *cmdPool));
	const VkSubmitInfo				submitInfo			=
														{
															VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType				sType;
															DE_NULL,						// const void*					pNext;
															0u,								// deUint32						waitSemaphoreCount;
															DE_NULL,						// const VkSemaphore*			pWaitSemaphores;
															DE_NULL,						// const VkPipelineStageFlags*	pWaitDstStageMask;
															1u,								// deUint32						commandBufferCount;
															&cmdBuffer.get(),				// const VkCommandBuffer*		pCommandBuffers;
															0u,								// deUint32						signalSemaphoreCount;
															DE_NULL,						// const VkSemaphore*			pSignalSemaphores;
														};
	const VkEventCreateInfo			eventInfo			=
														{
															VK_STRUCTURE_TYPE_EVENT_CREATE_INFO,
															DE_NULL,
															0
														};
	const Unique<VkEvent>			event				(createEvent(vk, device, &eventInfo, DE_NULL));

	beginCommandBuffer(vk, *cmdBuffer);
	vk.cmdWaitEvents(*cmdBuffer, 1u, &event.get(), VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, 0u, DE_NULL, 0u, DE_NULL, 0u, DE_NULL);
	endCommandBuffer(vk, *cmdBuffer);

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
	if (VK_TIMEOUT != vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, SHORT_FENCE_WAIT))
		return tcu::TestStatus::fail("Queue should not end execution");

	if (VK_SUCCESS != vk.setEvent(device, *event))
		return tcu::TestStatus::fail("Couldn't set event");

	if (VK_SUCCESS != vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, LONG_FENCE_WAIT))
		return tcu::TestStatus::fail("Queue should end execution");

	return tcu::TestStatus::pass("Device wait for event tests pass");
}